

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InstanceConfigRuleSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InstanceConfigRuleSyntax,slang::syntax::InstanceConfigRuleSyntax_const&>
          (BumpAllocator *this,InstanceConfigRuleSyntax *args)

{
  InstanceConfigRuleSyntax *pIVar1;
  InstanceConfigRuleSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pIVar1 = (InstanceConfigRuleSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::InstanceConfigRuleSyntax::InstanceConfigRuleSyntax(in_RSI,pIVar1);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }